

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.h
# Opt level: O0

void __thiscall spvtools::opt::SSARewriter::SSARewriter(SSARewriter *this,MemPass *pass)

{
  MemPass *pass_local;
  SSARewriter *this_local;
  
  std::
  unordered_map<spvtools::opt::BasicBlock_*,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>_>
  ::unordered_map(&this->defs_at_block_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>_>
  ::unordered_map(&this->phi_candidates_);
  std::
  queue<spvtools::opt::SSARewriter::PhiCandidate*,std::deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>>
  ::
  queue<std::deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>,void>
            ((queue<spvtools::opt::SSARewriter::PhiCandidate*,std::deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>>
              *)&this->incomplete_phis_);
  std::
  vector<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ::vector(&this->phis_to_generate_);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->load_replacement_);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set(&this->sealed_blocks_);
  this->pass_ = pass;
  return;
}

Assistant:

SSARewriter(MemPass* pass) : pass_(pass) {}